

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void flatbuffers::anon_unknown_0::DeserializeDoc
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *doc,Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation)

{
  return_type this;
  uint i;
  string local_40;
  
  if (documentation != (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0) {
    for (i = 0; i < *(uint *)documentation; i = i + 1) {
      this = Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::Get(documentation,i);
      String::str_abi_cxx11_(&local_40,this);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)doc,&local_40)
      ;
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

static void DeserializeDoc(std::vector<std::string> &doc,
                           const Vector<Offset<String>> *documentation) {
  if (documentation == nullptr) return;
  for (uoffset_t index = 0; index < documentation->size(); index++)
    doc.push_back(documentation->Get(index)->str());
}